

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::TargetAmountMapData,_cfd::js::api::TargetAmountMapDataStruct>::
ConvertToStruct(vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::TargetAmountMapData,_cfd::js::api::TargetAmountMapDataStruct>
               *this)

{
  pointer pTVar1;
  pointer this_00;
  TargetAmountMapDataStruct data;
  TargetAmountMapDataStruct TStack_78;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar1 = (this->super_JsonVector<cfd::js::api::json::TargetAmountMapData>).
           super_vector<cfd::js::api::json::TargetAmountMapData,_std::allocator<cfd::js::api::json::TargetAmountMapData>_>
           .
           super__Vector_base<cfd::js::api::json::TargetAmountMapData,_std::allocator<cfd::js::api::json::TargetAmountMapData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_JsonVector<cfd::js::api::json::TargetAmountMapData>).
                 super_vector<cfd::js::api::json::TargetAmountMapData,_std::allocator<cfd::js::api::json::TargetAmountMapData>_>
                 .
                 super__Vector_base<cfd::js::api::json::TargetAmountMapData,_std::allocator<cfd::js::api::json::TargetAmountMapData>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1
      ) {
    js::api::json::TargetAmountMapData::ConvertToStruct(&TStack_78,this_00);
    std::
    vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
    ::push_back(__return_storage_ptr__,&TStack_78);
    js::api::TargetAmountMapDataStruct::~TargetAmountMapDataStruct(&TStack_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }